

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

void Gia_ManDupCollapse_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = p->pObjs;
  if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) goto LAB_0077dd61;
  iVar4 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar4) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar4] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar4] = p->nTravIds;
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2ea,"void Gia_ManDupCollapse_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
  }
  if (pGVar5 + p->nObjs <= pObj) goto LAB_0077dd61;
  piVar1 = p->pSibls;
  if ((piVar1 != (int *)0x0) && (piVar1[iVar4] != 0)) {
    if (piVar1 == (int *)0x0) {
LAB_0077dc32:
      pGVar5 = (Gia_Obj_t *)0x0;
    }
    else {
      uVar3 = piVar1[iVar4];
      if ((ulong)uVar3 == 0) goto LAB_0077dc32;
      if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) goto LAB_0077ddfc;
      pGVar5 = pGVar5 + uVar3;
    }
    Gia_ManDupCollapse_rec(p,pGVar5,pNew);
  }
  Gia_ManDupCollapse_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),pNew);
  Gia_ManDupCollapse_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
  uVar2 = *(ulong *)pObj;
  if (-1 < (int)pObj[-(uVar2 & 0x1fffffff)].Value) {
    uVar3 = (uint)(uVar2 >> 0x20);
    if (-1 < (int)pObj[-(ulong)(uVar3 & 0x1fffffff)].Value) {
      uVar3 = Gia_ManHashAnd(pNew,(uint)(uVar2 >> 0x1d) & 1 ^ pObj[-(uVar2 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
      pObj->Value = uVar3;
      pGVar5 = p->pObjs;
      if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
        piVar1 = p->pSibls;
        if ((piVar1 != (int *)0x0) &&
           (iVar4 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555, piVar1[iVar4] != 0)) {
          iVar4 = piVar1[iVar4];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_0077ddfc:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (((int)pGVar5[iVar4].Value < 0) || ((int)uVar3 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          pNew->pSibls[uVar3 >> 1] = pGVar5[iVar4].Value >> 1;
        }
        return;
      }
LAB_0077dd61:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManDupCollapse_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManDupCollapse_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin1(pObj), pNew );
//    assert( !~pObj->Value );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
}